

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O0

int get_eob_cost(int eob,LV_MAP_EOB_COST *txb_eob_costs,LV_MAP_COEFF_COST *txb_costs,
                TX_CLASS tx_class)

{
  int iVar1;
  char in_CL;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int offset_bits;
  int bit;
  int eob_shift;
  int eob_ctx;
  int eob_multi_ctx;
  int eob_cost;
  int eob_pt;
  int eob_extra;
  int local_28;
  uint local_20;
  char local_19;
  long local_18;
  long local_10;
  
  local_19 = in_CL;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = av1_get_eob_pos_token(in_EDI,(int *)&local_20);
  local_28 = *(int *)(local_10 + (long)(int)(uint)(local_19 != '\0') * 0x2c + (long)(iVar1 + -1) * 4
                     );
  if (0 < av1_eob_offset_bits[iVar1]) {
    local_28 = *(int *)(local_18 + 0x5d8 + (long)(iVar1 + -3) * 8 +
                       (long)(int)(uint)((local_20 &
                                         1 << ((char)av1_eob_offset_bits[iVar1] - 1U & 0x1f)) != 0)
                       * 4) + local_28;
    if (1 < av1_eob_offset_bits[iVar1]) {
      local_28 = (av1_eob_offset_bits[iVar1] + -1) * 0x200 + local_28;
    }
  }
  return local_28;
}

Assistant:

static int get_eob_cost(int eob, const LV_MAP_EOB_COST *txb_eob_costs,
                        const LV_MAP_COEFF_COST *txb_costs, TX_CLASS tx_class) {
  int eob_extra;
  const int eob_pt = av1_get_eob_pos_token(eob, &eob_extra);
  int eob_cost = 0;
  const int eob_multi_ctx = (tx_class == TX_CLASS_2D) ? 0 : 1;
  eob_cost = txb_eob_costs->eob_cost[eob_multi_ctx][eob_pt - 1];

  if (av1_eob_offset_bits[eob_pt] > 0) {
    const int eob_ctx = eob_pt - 3;
    const int eob_shift = av1_eob_offset_bits[eob_pt] - 1;
    const int bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
    eob_cost += txb_costs->eob_extra_cost[eob_ctx][bit];
    const int offset_bits = av1_eob_offset_bits[eob_pt];
    if (offset_bits > 1) eob_cost += av1_cost_literal(offset_bits - 1);
  }
  return eob_cost;
}